

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O1

Quat4f operator*(Quat4f *q,float f)

{
  float fVar1;
  float fVar2;
  float *in_RSI;
  undefined4 in_XMM0_Db;
  Quat4f QVar3;
  
  QVar3.m_elements[2] = *in_RSI * f;
  fVar1 = in_RSI[1];
  fVar2 = in_RSI[2];
  QVar3.m_elements[0] = f * in_RSI[3];
  QVar3.m_elements[1] = (float)in_XMM0_Db;
  q->m_elements[0] = QVar3.m_elements[2];
  q->m_elements[1] = fVar1 * f;
  q->m_elements[2] = fVar2 * f;
  q->m_elements[3] = QVar3.m_elements[0];
  QVar3.m_elements[3] = 0.0;
  return (Quat4f)QVar3.m_elements;
}

Assistant:

Quat4f operator * ( const Quat4f& q, float f )
{
	return Quat4f
	(
		f * q.w(),
		f * q.x(),
		f * q.y(),
		f * q.z()
	);
}